

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSources::DeleteOwnSSRC(RTPSources *this)

{
  uint uVar1;
  HashElement *pHVar2;
  RTPMemoryManager *pRVar3;
  RTPInternalSourceData *pRVar4;
  HashElement *pHVar5;
  HashElement *pHVar6;
  bool bVar7;
  
  if (this->owndata == (RTPInternalSourceData *)0x0) {
    return -0x42;
  }
  uVar1 = (this->owndata->super_RTPSourceData).ssrc;
  pHVar5 = (this->sourcelist).table[uVar1 % 0x207d];
  (this->sourcelist).curhashelem = pHVar5;
  bVar7 = false;
  do {
    if (pHVar5 == (HashElement *)0x0) break;
    if (pHVar5->key == uVar1) {
      bVar7 = true;
    }
    else {
      pHVar5 = pHVar5->hashnext;
      (this->sourcelist).curhashelem = pHVar5;
    }
  } while (!bVar7);
  pHVar5 = (this->sourcelist).curhashelem;
  if (pHVar5 == (HashElement *)0x0) goto LAB_0011e26d;
  pHVar6 = pHVar5->hashprev;
  pHVar2 = pHVar5->hashnext;
  if (pHVar6 == (HashElement *)0x0) {
    (this->sourcelist).table[pHVar5->hashindex] = pHVar2;
    if (pHVar2 != (HashElement *)0x0) {
      pHVar6 = (HashElement *)0x0;
      goto LAB_0011e1ef;
    }
  }
  else {
    pHVar6->hashnext = pHVar2;
    if (pHVar2 != (HashElement *)0x0) {
LAB_0011e1ef:
      pHVar2->hashprev = pHVar6;
    }
  }
  pHVar5 = (this->sourcelist).curhashelem;
  pHVar6 = pHVar5->listprev;
  pHVar2 = pHVar5->listnext;
  if (pHVar6 == (HashElement *)0x0) {
    (this->sourcelist).firsthashelem = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      (this->sourcelist).lasthashelem = (HashElement *)0x0;
    }
    else {
      pHVar2->listprev = (HashElement *)0x0;
    }
  }
  else {
    pHVar6->listnext = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      (this->sourcelist).lasthashelem = pHVar6;
    }
    else {
      pHVar2->listprev = pHVar6;
    }
  }
  pRVar3 = (this->sourcelist).super_RTPMemoryObject.mgr;
  if (pRVar3 == (RTPMemoryManager *)0x0) {
    if (pHVar5 != (HashElement *)0x0) {
      operator_delete(pHVar5,0x30);
    }
  }
  else {
    (*pRVar3->_vptr_RTPMemoryManager[3])(pRVar3,pHVar5);
  }
  (this->sourcelist).curhashelem = pHVar2;
LAB_0011e26d:
  this->totalcount = this->totalcount + -1;
  pRVar4 = this->owndata;
  if ((pRVar4->super_RTPSourceData).issender == true) {
    this->sendercount = this->sendercount + -1;
  }
  if (((pRVar4->super_RTPSourceData).validated == true) &&
     (((pRVar4->super_RTPSourceData).receivedbye & 1U) == 0)) {
    this->activecount = this->activecount + -1;
  }
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this);
  pRVar4 = this->owndata;
  pRVar3 = (this->super_RTPMemoryObject).mgr;
  if (pRVar3 == (RTPMemoryManager *)0x0) {
    if (pRVar4 != (RTPInternalSourceData *)0x0) {
      (*(pRVar4->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject[1])(pRVar4);
    }
  }
  else {
    (**(pRVar4->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject)(pRVar4);
    (*pRVar3->_vptr_RTPMemoryManager[3])(pRVar3,pRVar4);
  }
  this->owndata = (RTPInternalSourceData *)0x0;
  return 0;
}

Assistant:

int RTPSources::DeleteOwnSSRC()
{
	if (owndata == 0)
		return ERR_RTP_SOURCES_DONTHAVEOWNSSRC;

	uint32_t ssrc = owndata->GetSSRC();

	sourcelist.GotoElement(ssrc);
	sourcelist.DeleteCurrentElement();

	totalcount--;
	if (owndata->IsSender())
		sendercount--;
	if (owndata->IsActive())
		activecount--;

	OnRemoveSource(owndata);
	
	RTPDelete(owndata,GetMemoryManager());
	owndata = 0;
	return 0;
}